

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O0

void __thiscall Jupiter::Plugin::~Plugin(Plugin *this)

{
  bool bVar1;
  reference ppPVar2;
  const_iterator local_28;
  __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
  local_20;
  __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
  local_18;
  iterator itr;
  Plugin *this_local;
  
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_001ea650;
  (this->super_Rehashable)._vptr_Rehashable = (_func_int **)&PTR_OnRehash_001ea740;
  itr._M_current = (Plugin **)this;
  local_18._M_current =
       (Plugin **)
       std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::begin(&g_plugins);
  do {
    local_20._M_current =
         (Plugin **)
         std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::end(&g_plugins);
    bVar1 = __gnu_cxx::
            operator==<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
                      (&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001beff5:
      INIConfig::~INIConfig(&this->config);
      std::__cxx11::string::~string((string *)&this->name);
      Rehashable::~Rehashable(&this->super_Rehashable);
      Thinker::~Thinker(&this->super_Thinker);
      return;
    }
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
              ::operator*(&local_18);
    if (*ppPVar2 == this) {
      __gnu_cxx::
      __normal_iterator<Jupiter::Plugin*const*,std::vector<Jupiter::Plugin*,std::allocator<Jupiter::Plugin*>>>
      ::__normal_iterator<Jupiter::Plugin**>
                ((__normal_iterator<Jupiter::Plugin*const*,std::vector<Jupiter::Plugin*,std::allocator<Jupiter::Plugin*>>>
                  *)&local_28,&local_18);
      std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::erase(&g_plugins,local_28)
      ;
      goto LAB_001beff5;
    }
    __gnu_cxx::
    __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
    ::operator++(&local_18);
  } while( true );
}

Assistant:

Jupiter::Plugin::~Plugin() {
	for (auto itr = g_plugins.begin(); itr != g_plugins.end(); ++itr) {
		if (*itr == this) {
			g_plugins.erase(itr);
			break;
		}
	}
}